

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * c4::detail::aalloc_impl(size_t size,size_t alignment)

{
  bool bVar1;
  int iVar2;
  error_flags eVar3;
  ulong in_RSI;
  size_t in_RDI;
  int ret;
  size_t amult;
  void *mem;
  size_t local_28;
  void *local_20;
  ulong local_18;
  size_t local_10;
  void *local_8;
  
  local_28 = in_RSI;
  if (in_RSI < 8) {
    local_28 = 8;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = posix_memalign(&local_20,local_28,in_RDI);
  if (iVar2 == 0) {
    if (((ulong)local_20 & local_18 - 1) != 0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3f0daf,(char *)0x43d7,
                   "check failed: (uintptr_t(mem) & (alignment-1)) == 0\naddress %p is not aligned to %zu boundary"
                   ,local_20,local_18);
    }
    local_8 = local_20;
  }
  else {
    if (iVar2 == 0x16) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3f0daf,(char *)0x43cb,
                   "The alignment argument %zu was not a power of two, or was not a multiple of sizeof(void*)"
                   ,local_18);
    }
    else if (iVar2 == 0xc) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3f0daf,(char *)0x43d0,
                   "There was insufficient memory to fulfill the allocation request of %zu bytes (alignment=%lu)"
                   ,local_10,local_10);
    }
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* aalloc_impl(size_t size, size_t alignment)
{
    void *mem;
#if defined(C4_WIN) || defined(C4_XBOX)
    mem = ::_aligned_malloc(size, alignment);
    C4_CHECK(mem != nullptr || size == 0);
#elif defined(C4_ARM)
    // https://stackoverflow.com/questions/53614538/undefined-reference-to-posix-memalign-in-arm-gcc
    // https://electronics.stackexchange.com/questions/467382/e2-studio-undefined-reference-to-posix-memalign/467753
    mem = memalign(alignment, size);
    C4_CHECK(mem != nullptr || size == 0);
#elif defined(C4_POSIX) || defined(C4_IOS) || defined(C4_MACOS)
    // NOTE: alignment needs to be sized in multiples of sizeof(void*)
    size_t amult = alignment;
    if(C4_UNLIKELY(alignment < sizeof(void*)))
    {
        amult = sizeof(void*);
    }
    int ret = ::posix_memalign(&mem, amult, size);
    if(C4_UNLIKELY(ret))
    {
        if(ret == EINVAL)
        {
            C4_ERROR("The alignment argument %zu was not a power of two, "
                     "or was not a multiple of sizeof(void*)", alignment);
        }
        else if(ret == ENOMEM)
        {
            C4_ERROR("There was insufficient memory to fulfill the "
                     "allocation request of %zu bytes (alignment=%lu)", size, size);
        }
        return nullptr;
    }
#else
    C4_NOT_IMPLEMENTED_MSG("need to implement an aligned allocation for this platform");
#endif
    C4_ASSERT_MSG((uintptr_t(mem) & (alignment-1)) == 0, "address %p is not aligned to %zu boundary", mem, alignment);
    return mem;
}